

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator+=(TPZSFMatrix<long_double> *this,TPZSFMatrix<long_double> *A)

{
  longdouble *plVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *in_RSI;
  TPZSFMatrix<long_double> *in_RDI;
  longdouble *end;
  longdouble *dst;
  longdouble *src;
  char *in_stack_000001b8;
  char *in_stack_000001c0;
  longdouble *local_20;
  longdouble *local_18;
  
  lVar3 = (**(code **)(*in_RSI + 0x60))();
  iVar2 = (*(in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if (lVar3 != CONCAT44(extraout_var,iVar2)) {
    TPZMatrix<long_double>::Error(in_stack_000001c0,in_stack_000001b8);
  }
  local_18 = (longdouble *)in_RSI[4];
  local_20 = in_RDI->fElem;
  plVar1 = in_RDI->fElem;
  iVar2 = (*(in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])();
  while (local_20 < plVar1 + CONCAT44(extraout_var_00,iVar2)) {
    *local_20 = *local_20 + *local_18;
    local_20 = local_20 + 1;
    local_18 = local_18 + 1;
  }
  (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  return in_RDI;
}

Assistant:

TPZSFMatrix<TVar>  &
TPZSFMatrix<TVar> ::operator+=(const TPZSFMatrix<TVar>  &A )
{
	if ( A.Dim() != this->Dim() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Operator+= <matrixs with different dimensions>" );
	
	TVar *src = A.fElem;
	TVar *dst = fElem;
	TVar *end = &fElem[ Size() ];
	while ( dst < end )
		*dst++ += *src++;
	
	this->fDecomposed = 0;
	return( *this );
}